

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

void __thiscall
kj::_::Delimited<kj::ArrayPtr<int>_&>::~Delimited(Delimited<kj::ArrayPtr<int>_&> *this)

{
  Delimited<kj::ArrayPtr<int>_&> *this_local;
  
  Array<kj::CappedArray<char,_14UL>_>::~Array(&this->stringified);
  return;
}

Assistant:

Delimited(T array, kj::StringPtr delimiter)
      : array(kj::fwd<T>(array)), delimiter(delimiter) {}